

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matte.cpp
# Opt level: O0

RGBColor __thiscall pm::Matte::globalShade(Matte *this,ShadeRecord *sr)

{
  undefined8 uVar1;
  Vector3 *in_RDX;
  undefined8 extraout_XMM0_Qa;
  RGBColor RVar3;
  undefined1 local_a0 [12];
  RGBColor local_94;
  RGBColor local_88;
  RGBColor local_7c;
  undefined1 local_70 [8];
  Ray reflectedRay;
  float nDotWi;
  RGBColor f;
  float pdf;
  Vector3 wo;
  Vector3 wi;
  ShadeRecord *sr_local;
  Matte *this_local;
  RGBColor *L;
  float fVar2;
  
  RGBColor::RGBColor((RGBColor *)this);
  if (in_RDX[6].y == 0.0) {
    (**(code **)(*(long *)sr + 0x18))(&wi.y,sr,in_RDX);
    RGBColor::operator=((RGBColor *)this,(RGBColor *)&wi.y);
  }
  Vector3::Vector3((Vector3 *)&wo.y);
  Vector3::operator-((Vector3 *)&f.b);
  f.g = 0.0;
  Lambertian::sampleF((Lambertian *)&reflectedRay.d.z,(ShadeRecord *)&(sr->ray).d,in_RDX,
                      (Vector3 *)&f.b,&wo.y);
  reflectedRay.d.y = dot((Vector3 *)&in_RDX[3].y,(Vector3 *)&wo.y);
  Ray::Ray((Ray *)local_70,(Vector3 *)&in_RDX[1].y,(Vector3 *)&wo.y);
  uVar1._0_4_ = in_RDX[8].x;
  uVar1._4_4_ = in_RDX[8].y;
  (**(code **)(**(long **)&in_RDX[8].z + 0x18))
            (local_a0,*(long **)&in_RDX[8].z,uVar1,local_70,(int)in_RDX[6].y + 1);
  RGBColor::operator*(&local_94,(RGBColor *)&reflectedRay.d.z);
  RGBColor::operator*(&local_88,reflectedRay.d.y);
  RVar3 = RGBColor::operator/(&local_7c,f.g);
  fVar2 = RVar3.b;
  RGBColor::operator+=((RGBColor *)this,&local_7c);
  RVar3.b = fVar2;
  RVar3.r = (float)(int)extraout_XMM0_Qa;
  RVar3.g = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return RVar3;
}

Assistant:

RGBColor Matte::globalShade(ShadeRecord &sr) const
{
	RGBColor L;

	if (sr.depth == 0)
		L = areaLightShade(sr);

	Vector3 wi;
	const Vector3 wo = -sr.ray.d;
	float pdf = 0.0f;
	const RGBColor f = diffuseBrdf_.sampleF(sr, wo, wi, pdf);
	const float nDotWi = dot(sr.normal, wi);
	const Ray reflectedRay(sr.hitPoint, wi);

	L += f * sr.tracer.traceRay(sr.world, reflectedRay, sr.depth + 1) * nDotWi / pdf;

	return L;
}